

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expression cnn::expr::reshape(Expression *x,Dim *d)

{
  Dim *in_RDX;
  undefined8 extraout_RDX;
  initializer_list<cnn::VariableIndex> *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar1;
  ComputationGraph *pg;
  ComputationGraph *this;
  VariableIndex local_34;
  VariableIndex *local_30;
  undefined8 local_28;
  ComputationGraph *this_00;
  
  pg = (ComputationGraph *)in_RSI->_M_array;
  this = in_RDI;
  this_00 = in_RDI;
  VariableIndex::VariableIndex(&local_34,(VariableIndex *)&in_RSI->_M_len);
  local_30 = &local_34;
  local_28 = 1;
  ComputationGraph::add_function<cnn::Reshape,cnn::Dim_const&>(this_00,in_RSI,in_RDX);
  Expression::Expression((Expression *)this,pg,(VariableIndex *)in_RDI);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = this;
  return EVar1;
}

Assistant:

Expression reshape(const Expression& x, const Dim& d) { return Expression(x.pg, x.pg->add_function<Reshape>({x.i}, d)); }